

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_float>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_float>_>
         *this)

{
  FloatFormat *samplings;
  double *pdVar1;
  float fVar2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar4;
  ShaderExecutor *pSVar5;
  Variable<float> *pVVar6;
  pointer pcVar7;
  ostringstream oVar8;
  double **ppdVar9;
  pointer pfVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  undefined8 uVar15;
  IVal *pIVar16;
  undefined8 *puVar17;
  size_t sVar18;
  long lVar19;
  IVal IVar20;
  undefined1 auVar21 [8];
  long lVar22;
  TestStatus *pTVar23;
  double dVar24;
  double dVar25;
  FuncSet funcs;
  IVal in3;
  IVal in2;
  EvalContext ctx;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<float,_float>_> outputs;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ostringstream oss;
  void *inputArr [4];
  ResultCollector status;
  uint in_stack_fffffffffffffaa8;
  undefined4 uStack_554;
  undefined8 local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_548;
  _Rb_tree_node_base *local_538;
  size_t local_530;
  string local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_508;
  FloatFormat *local_500;
  size_t local_4f8;
  ulong local_4f0;
  IVal local_4e8;
  IVal local_4c8;
  TestStatus *local_4b0;
  undefined1 local_4a8 [8];
  double dStack_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_498;
  double local_488;
  Precision local_480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_478;
  undefined4 local_470;
  ios_base local_438 [8];
  ios_base local_430 [264];
  FloatFormat local_328;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2f8;
  Outputs<vkt::shaderexecutor::OutTypes<float,_float>_> local_2c8;
  pointer local_298;
  pointer local_290;
  Inputs<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_280;
  IVal local_220;
  undefined4 uStack_208;
  undefined4 uStack_204;
  ios_base local_1b0 [264];
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  ResultCollector local_80;
  
  this_00 = this->m_samplings;
  samplings = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar18 = (this->m_caseCtx).numRandoms;
  local_4b0 = __return_storage_ptr__;
  iVar13 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_500 = samplings;
  generateInputs<vkt::shaderexecutor::InTypes<float,float,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_280,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)samplings,(FloatFormat *)(ulong)PVar3,(Precision)sVar18,(ulong)(iVar13 + 0xdeadbeef)
             ,in_stack_fffffffffffffaa8);
  pfVar10 = local_280.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  sVar18 = (long)local_280.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_280.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  Outputs<vkt::shaderexecutor::OutTypes<float,_float>_>::Outputs(&local_2c8,sVar18);
  local_328.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_328.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_328.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_328.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_328.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_328.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_328.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_328.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_328._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2f8._M_impl.super__Rb_tree_header._M_header;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_508 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_a8 = local_280.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a0 = local_280.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_98 = local_280.in2.
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_90 = local_280.in3.
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_298 = local_2c8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_290 = local_2c8.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_4a8 = (undefined1  [8])local_508;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&dStack_4a0,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
  std::ios_base::~ios_base(local_430);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_220);
  local_550 = (double)((ulong)local_550._4_4_ << 0x20);
  aStack_548._M_allocated_capacity = 0;
  local_530 = 0;
  pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_548._8_8_ = (_Rb_tree_node_base *)&local_550;
  local_538 = (_Rb_tree_node_base *)&local_550;
  local_4f8 = sVar18;
  (*pSVar4->_vptr_Statement[4])(pSVar4,&stack0xfffffffffffffaa8);
  if ((_Rb_tree_node_base *)aStack_548._8_8_ != (_Rb_tree_node_base *)&local_550) {
    uVar15 = aStack_548._8_8_;
    do {
      (**(code **)(**(long **)(uVar15 + 0x20) + 0x30))(*(long **)(uVar15 + 0x20),&local_220);
      uVar15 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar15);
    } while ((_Rb_tree_node_base *)uVar15 != (_Rb_tree_node_base *)&local_550);
  }
  sVar18 = local_4f8;
  if (local_530 != 0) {
    local_4a8 = (undefined1  [8])local_508;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_4a0,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_4a0,
               (char *)CONCAT71(local_528._M_dataplus._M_p._1_7_,local_528._M_dataplus._M_p._0_1_),
               local_528._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_528._M_dataplus._M_p._1_7_,local_528._M_dataplus._M_p._0_1_) !=
        &local_528.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_528._M_dataplus._M_p._1_7_,local_528._M_dataplus._M_p._0_1_),
                      local_528.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
    std::ios_base::~ios_base(local_430);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)&stack0xfffffffffffffaa8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_220);
  std::ios_base::~ios_base(local_1b0);
  pSVar5 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar5->_vptr_ShaderExecutor[2])(pSVar5,sVar18 & 0xffffffff,&local_a8,&local_298,0);
  local_4a8 = (undefined1  [8])((ulong)local_4a8 & 0xffffffffffffff00);
  dStack_4a0 = INFINITY;
  aStack_498._M_allocated_capacity = 0xfff0000000000000;
  local_220._0_8_ = local_220._0_8_ & 0xffffffffffffff00;
  local_220.m_lo = INFINITY;
  local_220.m_hi = -INFINITY;
  in_stack_fffffffffffffaa8 = in_stack_fffffffffffffaa8 & 0xffffff00;
  local_550 = INFINITY;
  aStack_548._M_allocated_capacity = 0xfff0000000000000;
  local_528._M_dataplus._M_p._0_1_ = 0;
  local_528._M_string_length = 0x7ff0000000000000;
  local_528.field_2._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<float>
            ((Environment *)&local_2f8,
             (this->m_variables).in0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_4a8);
  Environment::bind<float>
            ((Environment *)&local_2f8,
             (this->m_variables).in1.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,&local_220);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2f8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2f8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4e8);
  Environment::bind<float>
            ((Environment *)&local_2f8,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)&stack0xfffffffffffffaa8);
  Environment::bind<float>
            ((Environment *)&local_2f8,
             (this->m_variables).out1.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)&local_528);
  if (local_280.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish == pfVar10) {
LAB_00885734:
    local_4a8 = (undefined1  [8])local_508;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"All ",4);
    pTVar23 = local_4b0;
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
    std::ios_base::~ios_base(local_430);
    local_4a8 = (undefined1  [8])&aStack_498;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"Pass","");
    pTVar23->m_code = QP_TEST_RESULT_PASS;
    (pTVar23->m_description)._M_dataplus._M_p = (pointer)&(pTVar23->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar23->m_description,local_4a8,
               (char *)((long)local_4a8 + (long)dStack_4a0));
    uVar15 = aStack_498._M_allocated_capacity;
    auVar21 = local_4a8;
    if (local_4a8 == (undefined1  [8])&aStack_498) goto LAB_00885911;
  }
  else {
    lVar19 = sVar18 + (sVar18 == 0);
    lVar22 = 0;
    local_4f0 = 0;
    do {
      local_4c8._0_8_ = local_4c8._0_8_ & 0xffffffffffffff00;
      local_4c8.m_lo = INFINITY;
      local_4c8.m_hi = -INFINITY;
      local_4e8._0_8_ = local_4e8._0_8_ & 0xffffffffffffff00;
      local_4e8.m_lo = INFINITY;
      local_4e8.m_hi = -INFINITY;
      dVar25 = (double)*(float *)((long)local_280.in0.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar22);
      oVar8 = (ostringstream)
              NAN(*(float *)((long)local_280.in0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar22));
      dStack_4a0 = INFINITY;
      if (!(bool)oVar8) {
        dStack_4a0 = dVar25;
      }
      aStack_498._M_allocated_capacity = (size_type)-INFINITY;
      if (!(bool)oVar8) {
        aStack_498._M_allocated_capacity = (size_type)dVar25;
      }
      local_4a8[0] = oVar8;
      tcu::FloatFormat::roundOut
                ((Interval *)&stack0xfffffffffffffaa8,local_500,(Interval *)local_4a8,false);
      tcu::FloatFormat::convert(&local_220,local_500,(Interval *)&stack0xfffffffffffffaa8);
      pIVar16 = Environment::lookup<float>
                          ((Environment *)&local_2f8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      pIVar16->m_hi = local_220.m_hi;
      pIVar16->m_hasNaN = local_220.m_hasNaN;
      *(undefined7 *)&pIVar16->field_0x1 = local_220._1_7_;
      pIVar16->m_lo = local_220.m_lo;
      dVar25 = (double)*(float *)((long)local_280.in1.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar22);
      local_4a8[0] = (ostringstream)
                     NAN(*(float *)((long)local_280.in1.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar22));
      dStack_4a0 = INFINITY;
      if (!(bool)local_4a8[0]) {
        dStack_4a0 = dVar25;
      }
      aStack_498._M_allocated_capacity = (size_type)-INFINITY;
      if (!(bool)local_4a8[0]) {
        aStack_498._M_allocated_capacity = (size_type)dVar25;
      }
      tcu::FloatFormat::roundOut
                ((Interval *)&stack0xfffffffffffffaa8,local_500,(Interval *)local_4a8,false);
      tcu::FloatFormat::convert(&local_220,local_500,(Interval *)&stack0xfffffffffffffaa8);
      pIVar16 = Environment::lookup<float>
                          ((Environment *)&local_2f8,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      pIVar16->m_hi = local_220.m_hi;
      pIVar16->m_hasNaN = local_220.m_hasNaN;
      *(undefined7 *)&pIVar16->field_0x1 = local_220._1_7_;
      pIVar16->m_lo = local_220.m_lo;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2f8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2f8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_480 = (this->m_caseCtx).precision;
      local_488 = local_500->m_maxValue;
      local_4a8 = *(undefined1 (*) [8])local_500;
      dStack_4a0 = *(double *)&local_500->m_fractionBits;
      aStack_498._M_allocated_capacity = *(undefined8 *)&local_500->m_hasInf;
      aStack_498._8_1_ = local_500->m_exactPrecision;
      aStack_498._9_7_ = *(undefined7 *)&local_500->field_0x19;
      local_470 = 0;
      pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_478 = &local_2f8;
      (*pSVar4->_vptr_Statement[3])(pSVar4,(Interval *)local_4a8);
      pIVar16 = Environment::lookup<float>
                          ((Environment *)&local_2f8,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_4a8,&local_328,pIVar16);
      local_4e8.m_hi = (double)aStack_498._M_allocated_capacity;
      local_4e8._0_8_ = local_4a8;
      uVar15 = local_4e8._0_8_;
      local_4e8.m_lo = dStack_4a0;
      fVar2 = *(float *)((long)local_2c8.out1.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar22);
      dVar24 = (double)fVar2;
      dVar25 = dVar24;
      if (NAN(fVar2)) {
        dVar25 = INFINITY;
        dVar24 = -INFINITY;
      }
      IVar20 = (IVal)(dVar24 <= (double)aStack_498._M_allocated_capacity && dStack_4a0 <= dVar25);
      if ((NAN(fVar2)) &&
         (dVar24 <= (double)aStack_498._M_allocated_capacity && dStack_4a0 <= dVar25)) {
        local_4e8.m_hasNaN = local_4a8[0];
        IVar20 = (IVal)local_4e8.m_hasNaN;
      }
      local_4a8 = (undefined1  [8])&aStack_498;
      local_4e8._0_8_ = uVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 1 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(&local_80,(bool)((byte)IVar20 & 1),(string *)local_4a8);
      if (local_4a8 != (undefined1  [8])&aStack_498) {
        operator_delete((void *)local_4a8,(ulong)(aStack_498._M_allocated_capacity + 1));
      }
      pIVar16 = Environment::lookup<float>
                          ((Environment *)&local_2f8,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_4a8,&local_328,pIVar16);
      local_4c8.m_hi = (double)aStack_498._M_allocated_capacity;
      local_4c8._0_8_ = local_4a8;
      uVar15 = local_4c8._0_8_;
      local_4c8.m_lo = dStack_4a0;
      fVar2 = *(float *)((long)local_2c8.out0.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar22);
      dVar24 = (double)fVar2;
      dVar25 = dVar24;
      if (NAN(fVar2)) {
        dVar25 = INFINITY;
        dVar24 = -INFINITY;
      }
      IVar20 = (IVal)(dVar24 <= (double)aStack_498._M_allocated_capacity && dStack_4a0 <= dVar25);
      if ((NAN(fVar2)) &&
         (dVar24 <= (double)aStack_498._M_allocated_capacity && dStack_4a0 <= dVar25)) {
        local_4c8.m_hasNaN = local_4a8[0];
        IVar20 = (IVal)local_4c8.m_hasNaN;
      }
      local_4a8 = (undefined1  [8])&aStack_498;
      local_4c8._0_8_ = uVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4a8,"Shader output 0 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(&local_80,(bool)((byte)IVar20 & 1),(string *)local_4a8);
      if (local_4a8 != (undefined1  [8])&aStack_498) {
        operator_delete((void *)local_4a8,(ulong)(aStack_498._M_allocated_capacity + 1));
      }
      if (!bVar11 || !bVar12) {
        uVar14 = (int)local_4f0 + 1;
        local_4f0 = (ulong)uVar14;
        ppdVar9 = (double **)&local_220.m_hi;
        if ((int)uVar14 < 0x65) {
          local_4a8 = (undefined1  [8])local_508;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\t",1);
          pVVar6 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_220._0_8_ = ppdVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)local_220._0_8_,(long)local_220.m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," = ",3);
          valueToString<float>
                    ((string *)&stack0xfffffffffffffaa8,&local_328,
                     (float *)((long)local_280.in0.super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar22));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8),
                     (long)local_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8) != &aStack_548) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8),
                            (ulong)(aStack_548._M_allocated_capacity + 1));
          }
          if ((double **)local_220._0_8_ != ppdVar9) {
            operator_delete((void *)local_220._0_8_,(long)local_220.m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\t",1);
          pVVar6 = (this->m_variables).in1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_220._0_8_ = ppdVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)local_220._0_8_,(long)local_220.m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," = ",3);
          valueToString<float>
                    ((string *)&stack0xfffffffffffffaa8,&local_328,
                     (float *)((long)local_280.in1.super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar22));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8),
                     (long)local_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8) != &aStack_548) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8),
                            (ulong)(aStack_548._M_allocated_capacity + 1));
          }
          if ((double **)local_220._0_8_ != ppdVar9) {
            operator_delete((void *)local_220._0_8_,(long)local_220.m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\t",1);
          pVVar6 = (this->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_220._0_8_ = ppdVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)local_220._0_8_,(long)local_220.m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," = ",3);
          valueToString<float>
                    ((string *)&stack0xfffffffffffffaa8,&local_328,
                     (float *)((long)local_2c8.out0.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar22));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8),
                     (long)local_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,"\tExpected range: ",0x11);
          intervalToString<float>(&local_528,&local_328,&local_4c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,
                     (char *)CONCAT71(local_528._M_dataplus._M_p._1_7_,
                                      local_528._M_dataplus._M_p._0_1_),local_528._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_528._M_dataplus._M_p._1_7_,local_528._M_dataplus._M_p._0_1_) !=
              &local_528.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_528._M_dataplus._M_p._1_7_,
                                     local_528._M_dataplus._M_p._0_1_),
                            local_528.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8) != &aStack_548) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8),
                            (ulong)(aStack_548._M_allocated_capacity + 1));
          }
          if ((double **)local_220._0_8_ != ppdVar9) {
            operator_delete((void *)local_220._0_8_,(long)local_220.m_hi + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\t",1);
          pVVar6 = (this->m_variables).out1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
          pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
          local_220._0_8_ = ppdVar9;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)local_220._0_8_,(long)local_220.m_lo);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," = ",3);
          valueToString<float>
                    ((string *)&stack0xfffffffffffffaa8,&local_328,
                     (float *)((long)local_2c8.out1.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar22));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,(char *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8),
                     (long)local_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,"\tExpected range: ",0x11);
          intervalToString<float>(&local_528,&local_328,&local_4e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_4a0,
                     (char *)CONCAT71(local_528._M_dataplus._M_p._1_7_,
                                      local_528._M_dataplus._M_p._0_1_),local_528._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_528._M_dataplus._M_p._1_7_,local_528._M_dataplus._M_p._0_1_) !=
              &local_528.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_528._M_dataplus._M_p._1_7_,
                                     local_528._M_dataplus._M_p._0_1_),
                            local_528.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8) != &aStack_548) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8),
                            (ulong)(aStack_548._M_allocated_capacity + 1));
          }
          if ((double **)local_220._0_8_ != ppdVar9) {
            operator_delete((void *)local_220._0_8_,(long)local_220.m_hi + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
          std::ios_base::~ios_base(local_430);
        }
      }
      lVar22 = lVar22 + 4;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
    iVar13 = (int)local_4f0;
    if (iVar13 < 0x65) {
      if (iVar13 == 0) goto LAB_00885734;
    }
    else {
      local_4a8 = (undefined1  [8])local_508;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_4a0,iVar13 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
      std::ios_base::~ios_base(local_430);
    }
    local_4a8 = (undefined1  [8])local_508;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_4a0);
    std::ostream::operator<<((ostringstream *)&dStack_4a0,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_4a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_4a0," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_4a0);
    std::ios_base::~ios_base(local_430);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
    std::ostream::operator<<(local_4a8,iVar13);
    pTVar23 = local_4b0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
    std::ios_base::~ios_base(local_438);
    local_4a8 = (undefined1  [8])&aStack_498;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8," test failed. Check log for the details","");
    uVar15 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_554,in_stack_fffffffffffffaa8) != &aStack_548) {
      uVar15 = aStack_548._M_allocated_capacity;
    }
    if ((ulong)uVar15 < (_Base_ptr)((long)dStack_4a0 + (long)local_550)) {
      uVar15 = (_Base_ptr)0xf;
      if (local_4a8 != (undefined1  [8])&aStack_498) {
        uVar15 = aStack_498._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (_Base_ptr)((long)dStack_4a0 + (long)local_550)) goto LAB_00885727;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_4a8,0,(char *)0x0,
                           CONCAT44(uStack_554,in_stack_fffffffffffffaa8));
    }
    else {
LAB_00885727:
      puVar17 = (undefined8 *)
                std::__cxx11::string::_M_append(&stack0xfffffffffffffaa8,(ulong)local_4a8);
    }
    pdVar1 = (double *)(puVar17 + 2);
    if ((double *)*puVar17 == pdVar1) {
      local_220.m_hi = *pdVar1;
      uStack_208 = *(undefined4 *)(puVar17 + 3);
      uStack_204 = *(undefined4 *)((long)puVar17 + 0x1c);
      local_220._0_8_ = &local_220.m_hi;
    }
    else {
      local_220.m_hi = *pdVar1;
      local_220._0_8_ = (double *)*puVar17;
    }
    local_220.m_lo = (double)puVar17[1];
    *puVar17 = pdVar1;
    puVar17[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar23->m_code = QP_TEST_RESULT_FAIL;
    (pTVar23->m_description)._M_dataplus._M_p = (pointer)&(pTVar23->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar23->m_description,local_220._0_8_,
               (undefined1 *)((long)local_220.m_lo + local_220._0_8_));
    if ((double *)local_220._0_8_ != &local_220.m_hi) {
      operator_delete((void *)local_220._0_8_,(long)local_220.m_hi + 1);
    }
    if (local_4a8 != (undefined1  [8])&aStack_498) {
      operator_delete((void *)local_4a8,(ulong)(aStack_498._M_allocated_capacity + 1));
    }
    auVar21 = (undefined1  [8])CONCAT44(uStack_554,in_stack_fffffffffffffaa8);
    uVar15 = aStack_548._M_allocated_capacity;
    if (auVar21 == (undefined1  [8])&aStack_548) goto LAB_00885911;
  }
  operator_delete((void *)auVar21,(ulong)((long)&((_Base_ptr)uVar15)->_M_color + 1));
LAB_00885911:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2f8);
  if (local_2c8.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2c8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_280.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_280.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_280.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_280.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.in1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_280.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_280.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.in0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pTVar23;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}